

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bond.cpp
# Opt level: O2

Atom_p __thiscall indigox::Bond::Next(Bond *this,BondAtomIterator *it)

{
  _func_int **pp_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  Atom_p AVar2;
  
  pp_Var1 = (in_RDX._M_pi)->_vptr__Sp_counted_base;
  (in_RDX._M_pi)->_vptr__Sp_counted_base = pp_Var1 + 2;
  if ((BondAtomIterator *)(pp_Var1 + 2) == it + 7) {
    (this->super_CountableObject<indigox::Bond>).id_ = 0;
    (this->super_enable_shared_from_this<indigox::Bond>)._M_weak_this.
    super___weak_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  }
  else {
    std::__shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2> *)this);
    in_RDX._M_pi = extraout_RDX;
  }
  AVar2.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  AVar2.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Atom_p)AVar2.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Atom_p Bond::Next(BondAtomIterator &it) {
    ++it;
    return (it == atoms_.end()) ? Atom_p() : it->lock();
  }